

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kgc.cpp
# Opt level: O1

Value * __thiscall Kgc::allocValue(Kgc *this,ValueType type)

{
  pointer ppVVar1;
  Value *pVVar2;
  Kgc *this_00;
  
  this_00 = this;
  if (this->maxObjects_ <= this->numObjects_) {
    collect(this);
  }
  ppVVar1 = this->reserved[(int)type].super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (this->reserved[(int)type].super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppVVar1) {
    pVVar2 = allocNew(this_00,type);
  }
  else {
    pVVar2 = ppVVar1[-1];
    this->reserved[(int)type].super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar1 + -1;
  }
  pVVar2->next_ = this->firstObject_;
  this->firstObject_ = pVVar2;
  this->numObjects_ = this->numObjects_ + 1;
  this->totalObjects_[(int)type] = this->totalObjects_[(int)type] + 1;
  return pVVar2;
}

Assistant:

Value* Kgc::allocValue(ValueType type)
{
    if (numObjects_ >= maxObjects_)
    {
        collect();
    }
    
    Value *v = allocSpecial(type);
    v->next_ = firstObject_;
    firstObject_ = v;
    ++numObjects_;
    totalObjects_[(int)type]++;;
    return v;
}